

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  undefined **ppuVar1;
  uint __val;
  BaseType expr_type;
  Variant *pVVar2;
  ulong uVar3;
  SPIRType *pSVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint32_t uVar10;
  SPIRVariable *var;
  runtime_error *this_00;
  uint uVar11;
  bool bVar12;
  char (*in_R8) [10];
  string array_expr;
  string new_expr;
  uint32_t local_20c;
  SPIRType *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint *local_160;
  size_t local_158;
  size_t local_150;
  uint local_148 [8];
  char (*local_128) [4];
  size_t local_120;
  size_t local_118;
  char local_110 [8];
  uint32_t local_108;
  bool local_104;
  bool local_103;
  StorageClass local_100;
  TypedID<(diligent_spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  size_t local_e8;
  TypedID<(diligent_spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  if (((((this->backend).force_gl_in_out_block == true) &&
       (uVar3 = (ulong)source_id,
       uVar3 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
               buffer_size)) &&
      (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
      pVVar2[uVar3].type == TypeVariable)) &&
     ((local_20c = target_id, var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar3)
      , (var->storage | StorageClassUniform) == Output &&
      (local_208 = Compiler::get_variable_data_type(&this->super_Compiler,var),
      (local_208->array).super_VectorView<unsigned_int>.buffer_size != 0)))) {
    uVar10 = Compiler::get_decoration
                       (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
    bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,var);
    bVar12 = bVar6 && (uVar10 == 0x14 || uVar10 < 2);
    bVar7 = Compiler::is_tessellation_shader(&this->super_Compiler);
    bVar8 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
    pSVar4 = local_208;
    if ((bVar7 || bVar12) && (!bVar8)) {
      join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                (&local_1e0,(diligent_spirv_cross *)0x920159,(char (*) [2])&local_20c,
                 (uint *)"_unrolled",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (local_180,this,pSVar4,&local_1e0,(ulong)local_20c);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180
                 ,(char (*) [2])0x91f319);
      ppuVar1 = (undefined **)(local_180 + 0x10);
      if ((undefined **)local_180._0_8_ != ppuVar1) {
        operator_delete((void *)local_180._0_8_);
      }
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      local_200._M_string_length = 0;
      local_200.field_2._M_local_buf[0] = '\0';
      if ((pSVar4->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar4->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
        __val = (pSVar4->array).super_VectorView<unsigned_int>.ptr
                [(pSVar4->array).super_VectorView<unsigned_int>.buffer_size - 1];
        cVar9 = '\x01';
        if (9 < __val) {
          uVar11 = __val;
          cVar5 = '\x04';
          do {
            cVar9 = cVar5;
            if (uVar11 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_007630f8;
            }
            if (uVar11 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_007630f8;
            }
            if (uVar11 < 10000) goto LAB_007630f8;
            bVar7 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar5 = cVar9 + '\x04';
          } while (bVar7);
          cVar9 = cVar9 + '\x01';
        }
LAB_007630f8:
        local_180._0_8_ = ppuVar1;
        ::std::__cxx11::string::_M_construct((ulong)local_180,cVar9);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_180._0_8_,local_180._8_4_,__val);
        ::std::__cxx11::string::operator=((string *)&local_200,(string *)local_180);
        if ((undefined **)local_180._0_8_ != ppuVar1) {
          operator_delete((void *)local_180._0_8_);
        }
        if ((pSVar4->array).super_VectorView<unsigned_int>.ptr
            [(pSVar4->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this_00,"Cannot unroll an array copy from unsized array.");
          *(undefined ***)this_00 = &PTR__runtime_error_00b5dcd0;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        to_expression_abi_cxx11_
                  ((string *)local_180,this,
                   (pSVar4->array).super_VectorView<unsigned_int>.ptr
                   [(pSVar4->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
        ::std::__cxx11::string::operator=((string *)&local_200,(string *)local_180);
        if ((undefined **)local_180._0_8_ != ppuVar1) {
          operator_delete((void *)local_180._0_8_);
        }
      }
      statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                (this,(char (*) [25])"for (int i = 0; i < int(",&local_200,(char (*) [8])"); i++)");
      statement<char_const(&)[2]>(this,(char (*) [2])0x856ed9);
      this->indent = this->indent + 1;
      if (bVar12 && uVar10 != 0x14) {
        statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_1e0,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x91f319);
      }
      else if (uVar10 == 0x14 && (bVar6 && (uVar10 == 0x14 || uVar10 < 2))) {
        local_160 = local_148;
        local_180._8_4_ = 0;
        local_180._0_8_ = &PTR__SPIRType_00b5dcf8;
        local_180._12_4_ = 0x15;
        local_170._M_allocated_capacity._4_4_ = 0;
        local_170._8_4_ = 1;
        local_170._12_4_ = 1;
        local_158 = 0;
        local_150 = 8;
        local_128 = (char (*) [4])local_110;
        local_120 = 0;
        local_118 = 8;
        local_108 = 0;
        local_104 = false;
        local_103 = false;
        local_100 = Generic;
        local_f8 = local_e0;
        local_f0 = 0;
        local_e8 = 8;
        local_c0 = local_a8;
        local_b8 = 0;
        local_b0 = 8;
        local_68 = &p_Stack_38;
        local_88._0_7_ = 0;
        local_88._7_4_ = 0;
        local_6c.id = 0;
        local_88._12_4_ = 0;
        local_88._16_4_ = ImageFormatUnknown;
        local_88._20_4_ = AccessQualifierReadOnly;
        local_88._24_4_ = 0;
        local_60 = 1;
        local_58._M_nxt = (_Hash_node_base *)0x0;
        sStack_50 = 0;
        local_48 = 1.0;
        local_40 = 0;
        p_Stack_38 = (__node_base_ptr)0x0;
        local_170._M_allocated_capacity._0_4_ = 7;
        expr_type = pSVar4->basetype;
        join<std::__cxx11::string&,char_const(&)[4]>
                  (&local_1c0,(diligent_spirv_cross *)expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",
                   local_128);
        bitcast_expression(&local_1a0,this,(SPIRType *)local_180,expr_type,&local_1c0);
        statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,&local_1e0,(char (*) [7])"[i] = ",&local_1a0,(char (*) [2])0x91f319);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        SPIRType::~SPIRType((SPIRType *)local_180);
      }
      else {
        statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                  (this,&local_1e0,(char (*) [7])"[i] = ",expr,(char (*) [5])"[i];");
      }
      end_scope(this);
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput && var->storage != StorageClassOutput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) &&
	                  (builtin == BuiltInPointSize ||
	                   builtin == BuiltInPosition ||
	                   builtin == BuiltInSampleMask);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);
	bool is_sample_mask = is_builtin && builtin == BuiltInSampleMask;

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin && !is_sample_mask)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else if (is_sample_mask)
		{
			SPIRType target_type { OpTypeInt };
			target_type.basetype = SPIRType::Int;
			statement(new_expr, "[i] = ", bitcast_expression(target_type, type.basetype, join(expr, "[i]")), ";");
		}
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = std::move(new_expr);
	}
}